

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transpose.hpp
# Opt level: O1

SquareMatrix<double> __thiscall
qclab::dense::trans<qclab::dense::SquareMatrix<double>>(dense *this,SquareMatrix<double> *A)

{
  long lVar1;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  __uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true> extraout_RDX;
  _Head_base<0UL,_double_*,_false> _Var5;
  undefined8 *puVar6;
  _Head_base<0UL,_double_*,_false> _Var7;
  long lVar8;
  undefined8 *puVar9;
  bool bVar10;
  SquareMatrix<double> SVar11;
  
  SquareMatrix<double>::SquareMatrix((SquareMatrix<double> *)this,A);
  lVar3 = *(long *)this;
  _Var5._M_head_impl =
       (double *)
       extraout_RDX.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
       super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
       super__Head_base<0UL,_double_*,_false>._M_head_impl;
  if (1 < lVar3) {
    lVar4 = *(long *)(this + 8);
    _Var5._M_head_impl = (double *)(lVar3 + -2);
    puVar6 = (undefined8 *)(lVar4 + lVar3 * 8);
    _Var7._M_head_impl = (double *)0x0;
    do {
      lVar8 = 1;
      puVar9 = puVar6;
      do {
        uVar2 = *(undefined8 *)(lVar4 + lVar8 * 8);
        *(undefined8 *)(lVar4 + lVar8 * 8) = *puVar9;
        *puVar9 = uVar2;
        lVar1 = (long)_Var7._M_head_impl + lVar8;
        lVar8 = lVar8 + 1;
        puVar9 = puVar9 + lVar3;
      } while (lVar1 + 1 < lVar3);
      puVar6 = puVar6 + lVar3 + 1;
      lVar4 = lVar4 + lVar3 * 8 + 8;
      bVar10 = _Var7._M_head_impl != _Var5._M_head_impl;
      _Var7._M_head_impl = _Var7._M_head_impl + 1;
    } while (bVar10);
  }
  SVar11.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)_Var5._M_head_impl;
  SVar11.size_ = (size_type_conflict)this;
  return SVar11;
}

Assistant:

T trans( const T& A ) {
      T Atrans( A ) ;
      operateInPlace( Op::Trans , Atrans ) ;
      return Atrans ;
    }